

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O2

ChMatrix33<double> * __thiscall
chrono::fea::ChElementHexaANCF_3843::GetPK2Stress
          (ChMatrix33<double> *__return_storage_ptr__,ChElementHexaANCF_3843 *this,double xi,
          double eta,double zeta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ChMatrixNM<double,_6,_6> *pCVar12;
  ResScalar RVar13;
  ResScalar RVar14;
  ResScalar RVar15;
  ResScalar RVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  ChVectorN<double,_6> epsilon_combined;
  ChMatrixNMc<double,_3,_3> Fdot;
  ChMatrixNMc<double,_3,_3> F;
  ChVectorN<double,_6> sigmaPK2;
  ChMatrix33<double> J_0xi;
  Matrix3xN e_bar;
  MatrixNx3c Sxi_D;
  double local_ba0;
  double local_b98;
  double local_b90;
  ResScalar local_b88;
  ResScalar local_b80;
  ResScalar local_b78;
  double local_b68;
  ResScalar local_b60;
  ChMatrix33<double> *local_b58;
  Matrix<double,_3,_3,_0,_3,_3> local_b50;
  undefined1 local_b08 [48];
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_ad8;
  Matrix<double,_3,_3,_0,_3,_3> local_aa8;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_a60;
  BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> local_a30;
  undefined1 local_a00 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f8;
  XprTypeNested local_9f0;
  variable_if_dynamic<long,__1> vStack_9e8;
  variable_if_dynamic<long,__1> local_9e0;
  double dStack_9d8;
  undefined1 local_6c8 [72];
  undefined1 local_680 [768];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_380 [53];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  local_b58 = __return_storage_ptr__;
  Calc_Sxi_D(this,(MatrixNx3c *)local_380,xi,eta,zeta);
  local_680._0_8_ = &this->m_ebar0;
  local_a00 = (undefined1  [8])local_6c8;
  local_680._8_8_ = local_380;
  Eigen::NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,3,1,3,3>,Eigen::MatrixBase> *)local_a00,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_3,_0,_32,_3>,_0>_>
              *)local_680);
  local_680._0_8_ = local_380;
  local_680._8_8_ = (element_type *)local_6c8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Product<Eigen::Matrix<double,32,3,0,32,3>,Eigen::Inverse<Eigen::Matrix<double,3,3,1,3,3>>,0>>
            ((Matrix<double,_32,_3,_0,_32,_3> *)local_380,
             (Product<Eigen::Matrix<double,_32,_3,_0,_32,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_0>
              *)local_680);
  CalcCoordMatrix(this,(Matrix3xN *)local_680);
  local_a00 = (undefined1  [8])local_680;
  local_9f8._M_pi = local_380;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_aa8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_3,_0,_32,_3>,_0>_>
              *)local_a00);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_a00,&local_aa8,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_b50,&local_aa8,0);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_a00,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_b50);
  dVar7 = (RVar13 + -1.0) * 0.5;
  local_ba0 = dVar7;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_a00,&local_aa8,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_b50,&local_aa8,1);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_a00,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_b50);
  dVar8 = (RVar13 + -1.0) * 0.5;
  local_b98 = dVar8;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_a00,&local_aa8,2);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_b50,&local_aa8,2);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_a00,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_b50);
  dVar9 = (RVar13 + -1.0) * 0.5;
  local_b90 = dVar9;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_a00,&local_aa8,1);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_b50,&local_aa8,2);
  RVar13 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_a00,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_b50);
  local_b88 = RVar13;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_a00,&local_aa8,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_b50,&local_aa8,2);
  RVar14 = Eigen::internal::
           dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
           ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 local_a00,
                 (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                 &local_b50);
  local_b80 = RVar14;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  local_a00,&local_aa8,0);
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                  &local_b50,&local_aa8,1);
  local_b78 = Eigen::internal::
              dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
              ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    local_a00,
                    (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                    &local_b50);
  if (this->m_damping_enabled == true) {
    local_b60 = local_b78;
    CalcCoordDerivMatrix(this,(Matrix3xN *)local_a00);
    local_b08._8_8_ = local_380;
    local_b08._0_8_ =
         (BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)local_a00;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_b50,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_32,_1,_3,_32>,_Eigen::Matrix<double,_32,_3,_0,_32,_3>,_0>_>
                *)local_b08);
    local_b68 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_b08,&local_aa8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_ad8,&local_b50,0);
    auVar20._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_b08,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_ad8);
    auVar20._8_56_ = extraout_var;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = local_b68;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar7;
    auVar1 = vfmadd213sd_fma(auVar20._0_16_,auVar23,auVar1);
    local_ba0 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_b08,&local_aa8,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_ad8,&local_b50,1);
    auVar21._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_b08,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_ad8);
    auVar21._8_56_ = extraout_var_00;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar7;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dVar8;
    auVar1 = vfmadd213sd_fma(auVar21._0_16_,auVar24,auVar2);
    local_b98 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_b08,&local_aa8,2);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_ad8,&local_b50,2);
    auVar22._0_8_ =
         Eigen::internal::
         dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
         ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               local_b08,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
               &local_ad8);
    auVar22._8_56_ = extraout_var_01;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar7;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar9;
    auVar1 = vfmadd213sd_fma(auVar22._0_16_,auVar25,auVar3);
    local_b90 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_b08,&local_aa8,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_ad8,&local_b50,2);
    RVar15 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_b08,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_ad8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_a30,&local_b50,1);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_a60,&local_aa8,2);
    RVar16 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_a30,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_a60);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = dVar7;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = RVar13;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = RVar16 + RVar15;
    auVar1 = vfmadd213sd_fma(auVar17,auVar26,auVar4);
    local_b88 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_b08,&local_aa8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_ad8,&local_b50,2);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_b08,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_ad8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_a30,&local_b50,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_a60,&local_aa8,2);
    RVar15 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_a30,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_a60);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = dVar7;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = RVar14;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = RVar15 + RVar13;
    auVar1 = vfmadd213sd_fma(auVar18,auVar27,auVar5);
    local_b80 = auVar1._0_8_;
    dVar7 = this->m_Alpha;
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true> *)
                    local_b08,&local_aa8,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_ad8,&local_b50,1);
    RVar13 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   local_b08,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_ad8);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_a30,&local_b50,0);
    Eigen::internal::BlockImpl_dense<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true,_true>::
    BlockImpl_dense(&local_a60,&local_aa8,1);
    RVar14 = Eigen::internal::
             dot_nocheck<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>,_false>
             ::run((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_a30,
                   (MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_3,_1,_true>_> *)
                   &local_a60);
    auVar28._8_8_ = 0;
    auVar28._0_8_ = dVar7;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_b60;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = RVar14 + RVar13;
    auVar1 = vfmadd213sd_fma(auVar19,auVar28,auVar6);
    local_b78 = auVar1._0_8_;
  }
  std::__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2> *)local_a00,
             &(this->m_material).
              super___shared_ptr<chrono::fea::ChMaterialHexaANCF,_(__gnu_cxx::_Lock_policy)2>);
  pCVar12 = (ChMatrixNM<double,_6,_6> *)((long)local_a00 + 0x20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9f8);
  local_b50.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&local_ba0;
  local_b50.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       (double)pCVar12;
  Eigen::PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,6,6,1,6,6>,Eigen::Matrix<double,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,6,1,0,6,1>> *)local_a00,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
              *)&local_b50);
  auVar11._8_8_ = dStack_9d8;
  auVar11._0_8_ = local_9e0.m_value;
  auVar29._8_8_ = local_9f0;
  auVar29._0_8_ = local_9f0;
  auVar29._16_8_ = local_9f0;
  auVar29._24_8_ = local_9f0;
  (local_b58->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_a00;
  (local_b58->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       (double)local_9f8._M_pi;
  auVar10._8_8_ = local_9e0.m_value;
  auVar10._0_8_ = vStack_9e8.m_value;
  auVar1 = vunpcklpd_avx(auVar10,auVar11);
  auVar29 = vblendpd_avx(ZEXT1632(auVar1),auVar29,8);
  auVar29 = vpermpd_avx2(auVar29,0xc4);
  *(undefined1 (*) [32])
   ((local_b58->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 5) =
       auVar29;
  auVar1 = vshufpd_avx(auVar11,auVar11,1);
  *(undefined1 (*) [16])
   ((local_b58->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 1) =
       auVar1;
  (local_b58->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       dStack_9d8;
  return local_b58;
}

Assistant:

ChMatrix33<> ChElementHexaANCF_3843::GetPK2Stress(const double xi, const double eta, const double zeta) {
    MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives
    Calc_Sxi_D(Sxi_D, xi, eta, zeta);

    ChMatrix33<double> J_0xi;  // Element Jacobian between the reference configuration and normalized configuration
    J_0xi.noalias() = m_ebar0 * Sxi_D;

    Sxi_D = Sxi_D * J_0xi.inverse();  // Adjust the shape function derivative matrix to account for the potentially
                                      // distorted reference configuration

    Matrix3xN e_bar;  // Element coordinates in matrix form
    CalcCoordMatrix(e_bar);

    // Calculate the Deformation Gradient at the current point
    ChMatrixNMc<double, 3, 3> F = e_bar * Sxi_D;

    // Calculate the Green-Lagrange strain tensor at the current point in Voigt notation
    ChVectorN<double, 6> epsilon_combined;
    epsilon_combined(0) = 0.5 * (F.col(0).dot(F.col(0)) - 1);
    epsilon_combined(1) = 0.5 * (F.col(1).dot(F.col(1)) - 1);
    epsilon_combined(2) = 0.5 * (F.col(2).dot(F.col(2)) - 1);
    epsilon_combined(3) = F.col(1).dot(F.col(2));
    epsilon_combined(4) = F.col(0).dot(F.col(2));
    epsilon_combined(5) = F.col(0).dot(F.col(1));

    if (m_damping_enabled) {
        Matrix3xN ebardot;  // Element coordinate time derivatives in matrix form
        CalcCoordDerivMatrix(ebardot);

        // Calculate the time derivative of the Deformation Gradient at the current point
        ChMatrixNMc<double, 3, 3> Fdot = ebardot * Sxi_D;

        // Calculate the time derivative of the Green-Lagrange strain tensor in Voigt notation
        // and combine it with epsilon assuming a Linear Kelvin-Voigt Viscoelastic material model
        epsilon_combined(0) += m_Alpha * F.col(0).dot(Fdot.col(0));
        epsilon_combined(1) += m_Alpha * F.col(1).dot(Fdot.col(1));
        epsilon_combined(2) += m_Alpha * F.col(2).dot(Fdot.col(2));
        epsilon_combined(3) += m_Alpha * (F.col(1).dot(Fdot.col(2)) + Fdot.col(1).dot(F.col(2)));
        epsilon_combined(4) += m_Alpha * (F.col(0).dot(Fdot.col(2)) + Fdot.col(0).dot(F.col(2)));
        epsilon_combined(5) += m_Alpha * (F.col(0).dot(Fdot.col(1)) + Fdot.col(0).dot(F.col(1)));
    }

    const ChMatrixNM<double, 6, 6>& D = GetMaterial()->Get_D();

    ChVectorN<double, 6> sigmaPK2 = D * epsilon_combined;  // 2nd Piola Kirchhoff Stress tensor in Voigt notation

    ChMatrix33<> SPK2;
    SPK2(0, 0) = sigmaPK2(0);
    SPK2(1, 1) = sigmaPK2(1);
    SPK2(2, 2) = sigmaPK2(2);
    SPK2(1, 2) = sigmaPK2(3);
    SPK2(2, 1) = sigmaPK2(3);
    SPK2(0, 2) = sigmaPK2(4);
    SPK2(2, 0) = sigmaPK2(4);
    SPK2(0, 1) = sigmaPK2(5);
    SPK2(1, 0) = sigmaPK2(5);

    return SPK2;
}